

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O1

void NFreloc(NF_link_map *l,ProxyRecord *records)

{
  byte *__s2;
  uint uVar1;
  Elf64_Xword EVar2;
  Elf64_Xword EVar3;
  NF_link_map *pNVar4;
  void *pvVar5;
  Elf64_Xword EVar6;
  Elf64_Xword EVar7;
  Elf32_Word *pEVar8;
  Elf64_Dyn *pEVar9;
  int iVar10;
  Elf64_Rela *it;
  long lVar11;
  long *plVar12;
  undefined8 uVar13;
  NF_link_map **ppNVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  long *plVar18;
  ulong uVar19;
  byte *pbVar20;
  long *plVar21;
  Elf64_Dyn *pEVar22;
  void **ppvVar23;
  ulong uVar24;
  bool bVar25;
  void *local_80;
  
  if (l->l_info[7] != (Elf64_Dyn *)0x0) {
    ranges[0].start = (l->l_info[7]->d_un).d_ptr;
    ranges[0].size = (l->l_info[8]->d_un).d_ptr;
    ranges[0].nrelative = (l->l_info[0x22]->d_un).d_val;
  }
  if (l->l_info[0x14] != (Elf64_Dyn *)0x0) {
    ranges[1].start = (l->l_info[0x17]->d_un).d_ptr;
    ranges[1].size = (l->l_info[2]->d_un).d_ptr;
  }
  lVar11 = 0;
  do {
    plVar12 = (long *)ranges[lVar11].start;
    plVar21 = plVar12 + ranges[lVar11].nrelative * 3;
    plVar18 = (long *)(ranges[lVar11].size + (long)plVar12);
    if (0 < (long)ranges[lVar11].nrelative) {
      do {
        *(uint64_t *)(*plVar12 + l->l_addr) = plVar12[2] + l->l_addr;
        plVar12 = plVar12 + 3;
      } while (plVar12 < plVar21);
    }
    if (plVar21 < plVar18) {
      EVar2 = (l->l_info[6]->d_un).d_val;
      EVar3 = (l->l_info[5]->d_un).d_val;
      do {
        if ((int)plVar21[1] == 0x25) {
          uVar13 = (*(code *)(plVar21[2] + l->l_addr))();
          *(undefined8 *)(*plVar21 + l->l_addr) = uVar13;
        }
        else {
          uVar19 = (ulong)*(uint *)(EVar2 + ((ulong)plVar21[1] >> 0x20) * 0x18);
          __s2 = (byte *)(EVar3 + uVar19);
          for (ppNVar14 = l->l_search_list; pNVar4 = *ppNVar14, pNVar4 != (NF_link_map *)0x0;
              ppNVar14 = ppNVar14 + 1) {
            pvVar5 = records->pointer;
            if (pvVar5 == (void *)0x0) {
LAB_0010307a:
              pEVar9 = pNVar4->l_ld + -1;
              do {
                pEVar22 = pEVar9;
                pEVar9 = pEVar22 + 1;
              } while (pEVar22[1].d_tag != 5);
              EVar6 = pEVar22[1].d_un.d_val;
              do {
                pEVar22 = pEVar9;
                pEVar9 = pEVar22 + 1;
              } while (pEVar22->d_tag != 6);
              bVar17 = *__s2;
              if (bVar17 == 0) {
                uVar15 = 0x1505;
              }
              else {
                uVar15 = 0x1505;
                pbVar20 = (byte *)(uVar19 + EVar3 + 1);
                do {
                  uVar15 = (ulong)bVar17 + uVar15 * 0x21;
                  bVar17 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                } while (bVar17 != 0);
                uVar15 = uVar15 & 0xffffffff;
              }
              bVar25 = true;
              if (((uint)(pNVar4->l_gnu_bitmask[(uint)(uVar15 >> 6) & pNVar4->l_gnu_bitmask_idxbits]
                         >> ((byte)uVar15 & 0x3f)) &
                   (uint)(pNVar4->l_gnu_bitmask[(uint)(uVar15 >> 6) & pNVar4->l_gnu_bitmask_idxbits]
                         >> ((byte)(uVar15 >> ((byte)pNVar4->l_gnu_shift & 0x3f)) & 0x3f)) & 1) != 0
                 ) {
                if ((ulong)pNVar4->l_gnu_buckets[uVar15 % (ulong)pNVar4->l_nbuckets] != 0) {
                  EVar7 = (pEVar22->d_un).d_val;
                  pEVar8 = pNVar4->l_gnu_chain_zero;
                  uVar24 = (ulong)pNVar4->l_gnu_buckets[uVar15 % (ulong)pNVar4->l_nbuckets] << 2;
                  do {
                    uVar1 = *(uint *)((long)pEVar8 + uVar24);
                    if (((uint)uVar15 ^ uVar1) < 2) {
                      uVar16 = uVar24 >> 2 & 0xffffffff;
                      iVar10 = strcmp((char *)(*(uint *)(EVar7 + uVar16 * 0x18) + EVar6),
                                      (char *)__s2);
                      if (iVar10 == 0) {
                        local_80 = (void *)(pNVar4->l_addr + *(long *)(EVar7 + uVar16 * 0x18 + 8));
                        bVar25 = false;
                        goto LAB_001031cb;
                      }
                    }
                    uVar24 = uVar24 + 4;
                  } while ((uVar1 & 1) == 0);
                }
                bVar25 = true;
              }
            }
            else {
              iVar10 = strcmp(records->name,(char *)__s2);
              ppvVar23 = &records[1].pointer;
              while (iVar10 != 0) {
                pvVar5 = *ppvVar23;
                if (pvVar5 == (void *)0x0) goto LAB_0010307a;
                iVar10 = strcmp(((ProxyRecord *)(ppvVar23 + -1))->name,(char *)__s2);
                ppvVar23 = ppvVar23 + 2;
              }
              bVar25 = false;
              local_80 = pvVar5;
            }
LAB_001031cb:
            if (!bVar25) {
              *(long *)(*plVar21 + l->l_addr) = plVar21[2] + (long)local_80;
              break;
            }
          }
        }
        plVar21 = plVar21 + 3;
      } while (plVar21 < plVar18);
    }
    bVar25 = lVar11 != 0;
    lVar11 = lVar11 + 1;
    if (bVar25) {
      return;
    }
  } while( true );
}

Assistant:

void NFreloc(struct NF_link_map *l, const ProxyRecord *records)
{
    /* set up range[0] for relative reloc and global vars */
    if (l->l_info[DT_RELA])
    {
        ranges[0].start = l->l_info[DT_RELA]->d_un.d_ptr;
        ranges[0].size = l->l_info[DT_RELASZ]->d_un.d_val;
        ranges[0].nrelative = l->l_info[34]->d_un.d_val; //relacount is now at 34
    }
    /* set up range[1] for function reloc */
    if (l->l_info[DT_PLTREL]) //TODO: Also check reloc type: it is REL/RELA? Only 2 options?
    {
        ranges[1].start = l->l_info[DT_JMPREL]->d_un.d_ptr;
        ranges[1].size = l->l_info[DT_PLTRELSZ]->d_un.d_val;
        //TODO: check lazy or not here
    }

    /* do actucal reloc here using ranges set up */
    for (int i = 0; i < 2; ++i)
        do_reloc(l, &ranges[i], records);

    /* UPD: this is totally wrong, for unload search list should be in the destructor of the NF */
    /* NFclose function should take care of this */
    /* now the reloc is done, dlclose the dlopened objs before */
    /* struct link_map **lm = l -> l_search_list;
    while(*lm)
    {
        dlclose(*lm);
        lm++;
    } */
    //TODO: add a mprotect to protect the already relocated entries from writing
}